

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O1

void ngram_compute_seg_score
               (ngram_search_t *ngs,bptbl_t *be,float32 lwf,int32 *out_ascr,int32 *out_lscr)

{
  int iVar1;
  dict_t *d;
  bptbl_t *pbVar2;
  int iVar3;
  int32 iVar4;
  long lVar5;
  int32 *piVar6;
  int32 n_used;
  int32 local_34;
  
  lVar5 = (long)be->bp;
  if (lVar5 == -1) {
    *out_ascr = be->score;
    *out_lscr = 0;
  }
  else {
    d = (ngs->base).dict;
    pbVar2 = ngs->bp_table;
    iVar3 = be->wid;
    if ((long)pbVar2[lVar5].last2_phone == -1) {
      piVar6 = &pbVar2[lVar5].score;
    }
    else {
      piVar6 = ngs->bscore_stack +
               (long)((ngs->base).d2p)->rssid[pbVar2[lVar5].last_phone][pbVar2[lVar5].last2_phone].
                     cimap[*d->word[iVar3].ciphone] + (long)pbVar2[lVar5].s_idx;
    }
    iVar1 = *piVar6;
    if (iVar1 < -0x1fffffff) {
      __assert_fail("start_score BETTER_THAN WORST_SCORE",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                    ,0x2b9,
                    "void ngram_compute_seg_score(ngram_search_t *, bptbl_t *, float32, int32 *, int32 *)"
                   );
    }
    if (iVar3 == (ngs->base).silence_wid) {
      iVar3 = ngs->silpen;
    }
    else {
      iVar3 = dict_filler_word(d,iVar3);
      if (iVar3 == 0) {
        iVar4 = ngram_tg_score(ngs->lmset,be->real_wid,pbVar2[lVar5].real_wid,
                               pbVar2[lVar5].prev_real_wid,&local_34);
        iVar3 = (int)((float)(iVar4 >> 10) * (float)lwf);
      }
      else {
        iVar3 = ngs->fillpen;
      }
    }
    *out_lscr = iVar3;
    *out_ascr = be->score - (iVar1 + *out_lscr);
  }
  return;
}

Assistant:

void
ngram_compute_seg_score(ngram_search_t *ngs, bptbl_t *be, float32 lwf,
                        int32 *out_ascr, int32 *out_lscr)
{
    bptbl_t *pbe;
    int32 start_score;

    /* Start of utterance. */
    if (be->bp == NO_BP) {
        *out_ascr = be->score;
        *out_lscr = 0;
        return;
    }

    /* Otherwise, calculate lscr and ascr. */
    pbe = ngs->bp_table + be->bp;
    start_score = ngram_search_exit_score(ngs, pbe,
                                 dict_first_phone(ps_search_dict(ngs),be->wid));
    assert(start_score BETTER_THAN WORST_SCORE);

    /* FIXME: These result in positive acoustic scores when filler
       words have non-filler pronunciations.  That whole business
       is still pretty much broken but at least it doesn't
       segfault. */
    if (be->wid == ps_search_silence_wid(ngs)) {
        *out_lscr = ngs->silpen;
    }
    else if (dict_filler_word(ps_search_dict(ngs), be->wid)) {
        *out_lscr = ngs->fillpen;
    }
    else {
        int32 n_used;
        *out_lscr = ngram_tg_score(ngs->lmset,
                                   be->real_wid,
                                   pbe->real_wid,
                                   pbe->prev_real_wid,
                                   &n_used)>>SENSCR_SHIFT;
        *out_lscr = *out_lscr * lwf;
    }
    *out_ascr = be->score - start_score - *out_lscr;
}